

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> * __thiscall
cfd::Psbt::GetUtxoDataAll(Psbt *this,NetType net_type)

{
  _func_int *p_Var1;
  undefined1 uVar2;
  UtxoData *in_RSI;
  UtxoData *in_RDI;
  uint32_t index;
  uint32_t max;
  wally_psbt *psbt_pointer;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *list;
  NetType in_stack_000010b0;
  uint32_t in_stack_000010b4;
  Psbt *in_stack_000010b8;
  undefined7 in_stack_fffffffffffffad0;
  Psbt *in_stack_fffffffffffffb78;
  uint local_38;
  
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x51c914);
  uVar2 = HasAllUtxos(in_stack_fffffffffffffb78);
  if ((bool)uVar2) {
    p_Var1 = (in_RSI->block_hash)._vptr_BlockHash[3];
    for (local_38 = 0; local_38 < (uint)p_Var1; local_38 = local_38 + 1) {
      GetUtxoData(in_stack_000010b8,in_stack_000010b4,in_stack_000010b0);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::emplace_back<cfd::UtxoData>
                ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffad0),in_RSI);
      UtxoData::~UtxoData(in_RDI);
    }
  }
  return (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_RDI;
}

Assistant:

std::vector<UtxoData> Psbt::GetUtxoDataAll(NetType net_type) const {
  std::vector<UtxoData> list;
  if (!HasAllUtxos()) return list;

  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  uint32_t max = static_cast<uint32_t>(psbt_pointer->num_inputs);
  for (uint32_t index = 0; index < max; ++index) {
    list.emplace_back(GetUtxoData(index, net_type));
  }
  return list;
}